

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmutex.cpp
# Opt level: O2

bool __thiscall QBasicMutex::lockInternal(QBasicMutex *this,QDeadlineTimer deadlineTimer)

{
  __pointer_type pQVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  undefined8 in_R8;
  long in_FS_OFFSET;
  QDeadlineTimer deadline;
  QDeadlineTimer deadlineTimer_local;
  
  deadlineTimer_local._8_8_ = deadlineTimer._8_8_;
  deadlineTimer_local.t1 = deadlineTimer.t1;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QDeadlineTimer::hasExpired(&deadlineTimer_local);
  if (!bVar3) {
    if (deadlineTimer_local.t1 == 0x7fffffffffffffff) {
      lockInternal(this);
      bVar3 = true;
      goto LAB_0037fef6;
    }
    LOCK();
    pQVar1 = (this->d_ptr)._q_value._M_b._M_p;
    (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x3;
    UNLOCK();
    bVar3 = true;
    if (pQVar1 == (__pointer_type)0x0) goto LAB_0037fef6;
    do {
      deadline.t2 = (int)in_R8;
      deadline.type = (int)((ulong)in_R8 >> 0x20);
      deadline.t1._0_4_ = deadlineTimer_local.t2;
      deadline.t1._4_4_ = deadlineTimer_local.type;
      bVar4 = QtLinuxFutex::futexWait<QBasicAtomicPointer<QMutexPrivate>>
                        ((QtLinuxFutex *)this,(QBasicAtomicPointer<QMutexPrivate> *)&DAT_00000003,
                         (Type)deadlineTimer_local.t1,deadline);
      if (!bVar4) break;
      LOCK();
      pQVar1 = (this->d_ptr)._q_value._M_b._M_p;
      (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x3;
      UNLOCK();
      if (pQVar1 == (__pointer_type)0x0) goto LAB_0037fef6;
      bVar4 = QDeadlineTimer::hasExpired(&deadlineTimer_local);
    } while (!bVar4);
  }
  bVar3 = false;
LAB_0037fef6:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

Q_NEVER_INLINE
bool QBasicMutex::lockInternal(QDeadlineTimer deadlineTimer) noexcept(FutexAlwaysAvailable)
{
    if (deadlineTimer.hasExpired())
        return false;

    if (futexAvailable()) {
        if (Q_UNLIKELY(deadlineTimer.isForever())) {
            lockInternal();
            return true;
        }

        // The mutex is already locked, set a bit indicating we're waiting.
        // Note we must set to dummyFutexValue because there could be other threads
        // also waiting.
        if (d_ptr.fetchAndStoreAcquire(dummyFutexValue()) == nullptr)
            return true;

        for (;;) {
            if (!futexWait(d_ptr, dummyFutexValue(), deadlineTimer))
                return false;

            // We got woken up, so must try to acquire the mutex. We must set
            // to dummyFutexValue() again because there could be other threads
            // waiting.
            if (d_ptr.fetchAndStoreAcquire(dummyFutexValue()) == nullptr)
                return true;

            if (deadlineTimer.hasExpired())
                return false;
        }
    }

#if !defined(QT_ALWAYS_USE_FUTEX)
    while (!fastTryLock()) {
        QMutexPrivate *copy = d_ptr.loadAcquire();
        if (!copy) // if d is 0, the mutex is unlocked
            continue;

        if (copy == dummyLocked()) {
            if (deadlineTimer.hasExpired())
                return false;
            // The mutex is locked but does not have a QMutexPrivate yet.
            // we need to allocate a QMutexPrivate
            QMutexPrivate *newD = QMutexPrivate::allocate();
            if (!d_ptr.testAndSetOrdered(dummyLocked(), newD)) {
                //Either the mutex is already unlocked, or another thread already set it.
                newD->deref();
                continue;
            }
            copy = newD;
            //the d->refCount is already 1 the deref will occurs when we unlock
        }

        QMutexPrivate *d = static_cast<QMutexPrivate *>(copy);
        if (deadlineTimer.hasExpired() && !d->possiblyUnlocked.loadRelaxed())
            return false;

        // At this point we have a pointer to a QMutexPrivate. But the other thread
        // may unlock the mutex at any moment and release the QMutexPrivate to the pool.
        // We will try to reference it to avoid unlock to release it to the pool to make
        // sure it won't be released. But if the refcount is already 0 it has been released.
        if (!d->ref())
            continue; //that QMutexPrivate was already released

        // We now hold a reference to the QMutexPrivate. It won't be released and re-used.
        // But it is still possible that it was already re-used by another QMutex right before
        // we did the ref(). So check if we still hold a pointer to the right mutex.
        if (d != d_ptr.loadAcquire()) {
            //Either the mutex is already unlocked, or relocked with another mutex
            d->deref();
            continue;
        }

        // In this part, we will try to increment the waiters count.
        // We just need to take care of the case in which the old_waiters
        // is set to the BigNumber magic value set in unlockInternal()
        int old_waiters;
        do {
            old_waiters = d->waiters.loadAcquire();
            if (old_waiters == -QMutexPrivate::BigNumber) {
                // we are unlocking, and the thread that unlocks is about to change d to 0
                // we try to acquire the mutex by changing to dummyLocked()
                if (d_ptr.testAndSetAcquire(d, dummyLocked())) {
                    // Mutex acquired
                    d->deref();
                    return true;
                } else {
                    Q_ASSERT(d != d_ptr.loadRelaxed()); //else testAndSetAcquire should have succeeded
                    // Mutex is likely to bo 0, we should continue the outer-loop,
                    //  set old_waiters to the magic value of BigNumber
                    old_waiters = QMutexPrivate::BigNumber;
                    break;
                }
            }
        } while (!d->waiters.testAndSetRelaxed(old_waiters, old_waiters + 1));

        if (d != d_ptr.loadAcquire()) {
            // The mutex was unlocked before we incremented waiters.
            if (old_waiters != QMutexPrivate::BigNumber) {
                //we did not break the previous loop
                Q_ASSERT(d->waiters.loadRelaxed() >= 1);
                d->waiters.deref();
            }
            d->deref();
            continue;
        }

        if (d->wait(deadlineTimer)) {
            // reset the possiblyUnlocked flag if needed (and deref its corresponding reference)
            if (d->possiblyUnlocked.loadRelaxed() && d->possiblyUnlocked.testAndSetRelaxed(true, false))
                d->deref();
            d->derefWaiters(1);
            //we got the lock. (do not deref)
            Q_ASSERT(d == d_ptr.loadRelaxed());
            return true;
        } else {
            // timed out
            d->derefWaiters(1);
            //There may be a race in which the mutex is unlocked right after we timed out,
            // and before we deref the waiters, so maybe the mutex is actually unlocked.
            // Set the possiblyUnlocked flag to indicate this possibility.
            if (!d->possiblyUnlocked.testAndSetRelaxed(false, true)) {
                // We keep a reference when possiblyUnlocked is true.
                // but if possiblyUnlocked was already true, we don't need to keep the reference.
                d->deref();
            }
            return false;
        }
    }
    Q_ASSERT(d_ptr.loadRelaxed() != 0);
    return true;
#else
    Q_UNREACHABLE();
#endif
}